

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O1

void __thiscall
so_5::disp::adv_thread_pool::impl::agent_queue_t::push
          (agent_queue_t *this,execution_demand_t *demand)

{
  __atomic_flag_data_type _Var1;
  control_block_t *pcVar2;
  mbox_id_t mVar3;
  type_info *ptVar4;
  demand_t *pdVar5;
  
  pdVar5 = (demand_t *)operator_new(0x38);
  pcVar2 = demand->m_limit;
  mVar3 = demand->m_mbox_id;
  ptVar4 = (demand->m_msg_type)._M_target;
  (pdVar5->m_demand).m_receiver = demand->m_receiver;
  (pdVar5->m_demand).m_limit = pcVar2;
  (pdVar5->m_demand).m_mbox_id = mVar3;
  (pdVar5->m_demand).m_msg_type._M_target = ptVar4;
  (pdVar5->m_demand).m_message_ref.m_obj = (demand->m_message_ref).m_obj;
  (demand->m_message_ref).m_obj = (message_t *)0x0;
  (pdVar5->m_demand).m_demand_handler = demand->m_demand_handler;
  pdVar5->m_next = (demand_t *)0x0;
  while( true ) {
    LOCK();
    _Var1 = (this->m_lock).m_flag.super___atomic_flag_base._M_i;
    (this->m_lock).m_flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) break;
    sched_yield();
  }
  this->m_tail->m_next = pdVar5;
  this->m_tail = pdVar5;
  LOCK();
  (this->m_size).super___atomic_base<unsigned_long>._M_i =
       (this->m_size).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  if ((((this->m_head).m_next == this->m_tail) && (this->m_active == false)) &&
     ((this->m_workers & 1) == 0)) {
    this->m_active = true;
    (this->m_lock).m_flag.super___atomic_flag_base._M_i = false;
    reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::schedule
              (this->m_disp_queue,this);
    return;
  }
  (this->m_lock).m_flag.super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

virtual void
		push( execution_demand_t demand )
			{
				bool need_schedule = false;
				{
					// Do memory allocation before spinlock locking.
					auto new_demand = new demand_t( std::move( demand ) );

					std::lock_guard< spinlock_t > lock( m_lock );

					m_tail->m_next = new_demand;
					m_tail = m_tail->m_next;

					++m_size;

					if( m_head.m_next == m_tail )
						{
							// Queue was empty. Need to detect
							// necessity of queue activation.
							if( !m_active )
								if( !is_there_not_thread_safe_worker() )
								{
									need_schedule = true;
									m_active = true;
								}
						}

					SO_5_CHECK_INVARIANT( !empty(), this )
					SO_5_CHECK_INVARIANT( m_active || is_there_any_worker(), this )
					SO_5_CHECK_INVARIANT( !(need_schedule && !m_active), this )
				}

				if( need_schedule )
					m_disp_queue.schedule( this );
			}